

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int get_mean_dev_features(int16_t *data,int stride,int bw,int bh,float *features)

{
  int in_ECX;
  int in_EDX;
  int iVar1;
  int in_ESI;
  long in_RDI;
  float *in_R8;
  float fVar2;
  float fVar3;
  float lvl0_mean;
  float dev;
  float mean;
  int64_t x2_sum;
  int x_sum;
  int col;
  int row;
  float dev_sum;
  double mean2_sum;
  int num_sub_blks;
  int64_t total_x2_sum;
  int total_x_sum;
  int feature_idx;
  int sub_num;
  int num;
  int subw;
  int subh;
  int16_t *data_ptr;
  int local_84;
  int local_80;
  int in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  undefined4 local_70;
  float in_stack_ffffffffffffff94;
  int local_68;
  int local_64;
  int local_60;
  float local_5c;
  double local_58;
  int local_4c;
  long local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  float *local_20;
  int local_14;
  int local_10;
  int local_c;
  
  local_80 = in_ECX;
  if (in_EDX <= in_ECX) {
    local_80 = in_ECX >> 1;
  }
  local_2c = local_80;
  local_84 = in_EDX;
  if (in_ECX <= in_EDX) {
    local_84 = in_EDX >> 1;
  }
  local_30 = local_84;
  local_34 = in_EDX * in_ECX;
  local_38 = local_84 * local_80;
  local_3c = 2;
  local_40 = 0;
  local_48 = 0;
  local_4c = 0;
  local_58 = 0.0;
  local_5c = 0.0;
  local_28 = in_RDI;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  for (local_60 = 0; local_60 < local_14; local_60 = local_2c + local_60) {
    for (local_64 = 0; local_64 < local_10; local_64 = local_30 + local_64) {
      (*aom_get_blk_sse_sum)
                ((int16_t *)(local_28 + (long)(local_60 * local_c) * 2 + (long)local_64 * 2),local_c
                 ,local_30,local_2c,&local_68,(int64_t *)&local_70);
      local_40 = local_68 + local_40;
      local_48 = CONCAT44(in_stack_ffffffffffffff94,local_70) + local_48;
      in_stack_ffffffffffffff8c = (float)local_68 / (float)local_38;
      in_stack_ffffffffffffff88 =
           get_dev(in_stack_ffffffffffffff94,
                   (double)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   in_stack_ffffffffffffff84);
      iVar1 = local_3c + 1;
      local_20[local_3c] = in_stack_ffffffffffffff8c;
      local_3c = local_3c + 2;
      local_20[iVar1] = in_stack_ffffffffffffff88;
      local_58 = (double)(in_stack_ffffffffffffff8c * in_stack_ffffffffffffff8c) + local_58;
      local_5c = in_stack_ffffffffffffff88 + local_5c;
      local_4c = local_4c + 1;
    }
  }
  fVar2 = (float)local_40 / (float)local_34;
  *local_20 = fVar2;
  fVar3 = get_dev(in_stack_ffffffffffffff94,
                  (double)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),(int)fVar2);
  local_20[1] = fVar3;
  fVar2 = get_dev(in_stack_ffffffffffffff94,
                  (double)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),(int)fVar2);
  local_20[local_3c] = fVar2;
  local_20[local_3c + 1] = local_5c / (float)local_4c;
  return local_3c + 2;
}

Assistant:

static inline int get_mean_dev_features(const int16_t *data, int stride, int bw,
                                        int bh, float *features) {
  const int16_t *const data_ptr = &data[0];
  const int subh = (bh >= bw) ? (bh >> 1) : bh;
  const int subw = (bw >= bh) ? (bw >> 1) : bw;
  const int num = bw * bh;
  const int sub_num = subw * subh;
  int feature_idx = 2;
  int total_x_sum = 0;
  int64_t total_x2_sum = 0;
  int num_sub_blks = 0;
  double mean2_sum = 0.0f;
  float dev_sum = 0.0f;

  for (int row = 0; row < bh; row += subh) {
    for (int col = 0; col < bw; col += subw) {
      int x_sum;
      int64_t x2_sum;
      // TODO(any): Write a SIMD version. Clear registers.
      aom_get_blk_sse_sum(data_ptr + row * stride + col, stride, subw, subh,
                          &x_sum, &x2_sum);
      total_x_sum += x_sum;
      total_x2_sum += x2_sum;

      const float mean = (float)x_sum / sub_num;
      const float dev = get_dev(mean, (double)x2_sum, sub_num);
      features[feature_idx++] = mean;
      features[feature_idx++] = dev;
      mean2_sum += (double)(mean * mean);
      dev_sum += dev;
      num_sub_blks++;
    }
  }

  const float lvl0_mean = (float)total_x_sum / num;
  features[0] = lvl0_mean;
  features[1] = get_dev(lvl0_mean, (double)total_x2_sum, num);

  // Deviation of means.
  features[feature_idx++] = get_dev(lvl0_mean, mean2_sum, num_sub_blks);
  // Mean of deviations.
  features[feature_idx++] = dev_sum / num_sub_blks;

  return feature_idx;
}